

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O0

int64_t __thiscall SharedMemRingBuffer::GetMinIndexOfConsumers(SharedMemRingBuffer *this)

{
  bool bVar1;
  __int_type _Var2;
  int64_t nIndex;
  int i;
  bool is_found;
  int64_t min_index;
  __atomic_base<long> *in_stack_ffffffffffffffd8;
  undefined4 local_20;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = (__atomic_base<long> *)0x7fffffffffffffff;
  bVar1 = false;
  local_20 = 0;
  while( true ) {
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_ffffffffffffffd8);
    if (_Var2 <= local_20) break;
    in_stack_ffffffffffffffd8 =
         (__atomic_base<long> *)std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffffd8)
    ;
    if ((long)in_stack_ffffffffffffffd8 < (long)local_18) {
      bVar1 = true;
      local_18 = in_stack_ffffffffffffffd8;
    }
    local_20 = local_20 + 1;
  }
  if (bVar1) {
    local_8 = local_18;
  }
  else {
    local_8 = (__atomic_base<long> *)0x0;
  }
  return (int64_t)local_8;
}

Assistant:

int64_t SharedMemRingBuffer::GetMinIndexOfConsumers()
{
    int64_t min_index = INT64_MAX ;
    bool is_found = false;
    for(int i = 0; i < ring_buffer_status_on_shared_mem_->registered_consumer_count; i++) {
        int64_t nIndex = ring_buffer_status_on_shared_mem_->array_consumer_indexes[i];
        if( nIndex < min_index ) {
            min_index = nIndex;
            is_found = true;
        }
    }
    if(!is_found) {
        return 0;
    }
    return min_index ;
}